

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

void __thiscall
MemoryLeakDetector::
removeMemoryLeakInformationWithoutCheckingOrDeallocatingTheMemoryButDeallocatingTheAccountInformation
          (MemoryLeakDetector *this,TestMemoryAllocator *allocator,void *memory,
          bool allocatNodesSeperately)

{
  MemoryLeakDetectorNode *pMVar1;
  MemoryLeakDetectorNode *pMVar2;
  MemoryLeakDetectorNode *pMVar3;
  MemoryLeakDetectorNode *pMVar4;
  
  pMVar2 = (MemoryLeakDetectorNode *)
           (ulong)(uint)((int)memory + (int)((ulong)memory / 0x49) * -0x49);
  pMVar1 = (this->memoryTable_).table_[(long)pMVar2].head_;
  if (pMVar1 == (MemoryLeakDetectorNode *)0x0) {
LAB_00114bc5:
    pMVar1 = (MemoryLeakDetectorNode *)0x0;
  }
  else {
    if (*(void **)(pMVar1 + 0x10) == memory) {
      pMVar4 = (MemoryLeakDetectorNode *)0x0;
    }
    else {
      do {
        pMVar4 = pMVar1;
        pMVar1 = *(MemoryLeakDetectorNode **)(pMVar4 + 0x38);
        if (pMVar1 == (MemoryLeakDetectorNode *)0x0) goto LAB_00114bc5;
      } while (*(void **)(pMVar1 + 0x10) != memory);
    }
    pMVar2 = (MemoryLeakDetectorNode *)((this->memoryTable_).table_ + (long)pMVar2);
    pMVar3 = pMVar4 + 0x38;
    if (pMVar4 == (MemoryLeakDetectorNode *)0x0) {
      pMVar3 = pMVar2;
    }
    *(undefined8 *)pMVar3 = *(undefined8 *)(pMVar1 + 0x38);
  }
  if (!allocatNodesSeperately) {
    return;
  }
  (*allocator->_vptr_TestMemoryAllocator[9])
            (allocator,pMVar1,pMVar2,allocator->_vptr_TestMemoryAllocator[9]);
  return;
}

Assistant:

void MemoryLeakDetector::removeMemoryLeakInformationWithoutCheckingOrDeallocatingTheMemoryButDeallocatingTheAccountInformation(TestMemoryAllocator* allocator, void* memory, bool allocatNodesSeperately)
{
    MemoryLeakDetectorNode* node = memoryTable_.removeNode((char*) memory);
    if (allocatNodesSeperately) allocator->freeMemoryLeakNode( (char*) node);
}